

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
::Iterator<Kernel::Literal*>
          (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
           *this,SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  Kernel::RobSubstitution::RobSubstitution((RobSubstitution *)this);
  this[0xf0] = (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
                )0x0;
  *(undefined8 *)(this + 0x150) = 0;
  *(undefined8 *)(this + 200) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  *(undefined8 *)(this + 0x110) = 0;
  *(undefined8 *)(this + 0x118) = 0;
  *(undefined8 *)(this + 0x120) = 0;
  *(undefined8 *)(this + 0x128) = 0;
  *(undefined8 *)(this + 0x130) = 0;
  *(undefined8 *)(this + 0x138) = 0;
  *(undefined8 *)(this + 0x140) = 0;
  init<Kernel::Literal*>(this,parent,root,query,retrieveSubstitution,reversed);
  return;
}

Assistant:

Iterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args)
       : _algo()
      { init(parent, root, query, retrieveSubstitution, reversed, std::move(args)...); }